

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_fprintf(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  char *pcVar2;
  char *local_68;
  int local_4c;
  long *plStack_48;
  int nLen;
  io_private *pDev;
  char *zFormat;
  fprintf_data sFdata;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  sFdata.nCount = (jx9_int64)apArg;
  if (((nArg < 2) || (iVar1 = jx9_value_is_resource(*apArg), iVar1 == 0)) ||
     (iVar1 = jx9_value_is_string(*(jx9_value **)(sFdata.nCount + 8)), iVar1 == 0)) {
    jx9_context_throw_error(pCtx,2,"Invalid arguments");
    jx9_result_int(pCtx,0);
    return 0;
  }
  plStack_48 = (long *)jx9_value_to_resource(*(jx9_value **)sFdata.nCount);
  if ((plStack_48 == (long *)0x0) || (*(int *)((long)plStack_48 + 0x34) != 0xfeac14)) {
    jx9_context_throw_error(pCtx,2,"Expecting an IO handle");
    jx9_result_int(pCtx,0);
    return 0;
  }
  if ((*plStack_48 != 0) && (*(long *)(*plStack_48 + 0x40) != 0)) {
    pDev = (io_private *)jx9_value_to_string(*(jx9_value **)(sFdata.nCount + 8),&local_4c);
    if (local_4c < 1) {
      jx9_result_int(pCtx,0);
      return 0;
    }
    sFdata.pIO = (io_private *)0x0;
    zFormat = (char *)plStack_48;
    jx9InputFormat(fprintfConsumer,pCtx,(char *)pDev,local_4c,nArg + -1,
                   (jx9_value **)(sFdata.nCount + 8),&zFormat,0);
    jx9_result_int64(pCtx,(jx9_int64)sFdata.pIO);
    return 0;
  }
  pcVar2 = jx9_function_name(pCtx);
  if (*plStack_48 == 0) {
    local_68 = "null_stream";
  }
  else {
    local_68 = *(char **)*plStack_48;
  }
  jx9_context_throw_error_format
            (pCtx,2,"IO routine(%s) not implemented in the underlying stream(%s) device",pcVar2,
             local_68);
  jx9_result_int(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_fprintf(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	fprintf_data sFdata;
	const char *zFormat;
	io_private *pDev;
	int nLen;
	if( nArg < 2 || !jx9_value_is_resource(apArg[0]) || !jx9_value_is_string(apArg[1]) ){
		/* Missing/Invalid arguments, return zero */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Invalid arguments");
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract our private data */
	pDev = (io_private *)jx9_value_to_resource(apArg[0]);
	/* Make sure we are dealing with a valid io_private instance */
	if( IO_PRIVATE_INVALID(pDev) ){
		/*Expecting an IO handle */
		jx9_context_throw_error(pCtx, JX9_CTX_WARNING, "Expecting an IO handle");
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the target IO stream device */
	if( pDev->pStream == 0  || pDev->pStream->xWrite == 0 ){
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying stream(%s) device", 
			jx9_function_name(pCtx), pDev->pStream ? pDev->pStream->zName : "null_stream"
			);
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the string format */
	zFormat = jx9_value_to_string(apArg[1], &nLen);
	if( nLen < 1 ){
		/* Empty string, return zero */
		jx9_result_int(pCtx, 0);
		return JX9_OK;
	}
	/* Prepare our private data */
	sFdata.nCount = 0;
	sFdata.pIO = pDev;
	/* Format the string */
	jx9InputFormat(fprintfConsumer, pCtx, zFormat, nLen, nArg - 1, &apArg[1], (void *)&sFdata, FALSE);
	/* Return total number of bytes written */
	jx9_result_int64(pCtx, sFdata.nCount);
	return JX9_OK;
}